

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void aom_paeth_predictor_32x64_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long in_RCX;
  long in_RSI;
  undefined8 *in_RDI;
  __m128i *top1;
  undefined8 extraout_XMM0_Qa;
  __m128i *top0;
  __m128i *extraout_XMM0_Qb;
  __m128i r32h;
  __m128i r32l;
  __m128i rep;
  __m128i l;
  int j;
  int i;
  __m128i l16;
  __m128i one;
  __m128i tl16;
  __m128i bh;
  __m128i bl;
  __m128i ah;
  __m128i al;
  __m128i zero;
  __m128i b;
  __m128i a;
  __m128i *in_stack_fffffffffffffd50;
  __m128i *in_stack_fffffffffffffd58;
  __m128i *in_stack_fffffffffffffd60;
  __m128i *left_00;
  undefined8 uStack_290;
  int local_270;
  int local_26c;
  undefined8 *local_1b0;
  short local_118;
  short sStack_116;
  short sStack_114;
  short sStack_112;
  short sStack_110;
  short sStack_10e;
  short sStack_10c;
  short sStack_10a;
  
  local_1b0 = in_RDI;
  for (local_270 = 0; local_270 < 4; local_270 = local_270 + 1) {
    auVar2 = *(undefined1 (*) [16])(in_RCX + (local_270 << 4));
    left_00 = (__m128i *)0x8000800080008000;
    uStack_290 = 0x8000800080008000;
    for (local_26c = 0; local_26c < 0x10; local_26c = local_26c + 1) {
      auVar1._8_8_ = uStack_290;
      auVar1._0_8_ = left_00;
      pshufb(auVar2,auVar1);
      paeth_16x1_pred(left_00,in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                      in_stack_fffffffffffffd50);
      in_stack_fffffffffffffd58 = top1;
      in_stack_fffffffffffffd60 = top0;
      paeth_16x1_pred(left_00,top0,top1,in_stack_fffffffffffffd50);
      *local_1b0 = in_stack_fffffffffffffd58;
      local_1b0[1] = in_stack_fffffffffffffd60;
      local_1b0[2] = extraout_XMM0_Qa;
      local_1b0[3] = extraout_XMM0_Qb;
      local_1b0 = (undefined8 *)(in_RSI + (long)local_1b0);
      local_118 = (short)left_00;
      sStack_116 = (short)((ulong)left_00 >> 0x10);
      sStack_114 = (short)((ulong)left_00 >> 0x20);
      sStack_112 = (short)((ulong)left_00 >> 0x30);
      sStack_110 = (short)uStack_290;
      sStack_10e = (short)((ulong)uStack_290 >> 0x10);
      sStack_10c = (short)((ulong)uStack_290 >> 0x20);
      sStack_10a = (short)((ulong)uStack_290 >> 0x30);
      left_00 = (__m128i *)
                CONCAT26(sStack_112 + 1,
                         CONCAT24(sStack_114 + 1,CONCAT22(sStack_116 + 1,local_118 + 1)));
      uStack_290 = CONCAT26(sStack_10a + 1,
                            CONCAT24(sStack_10c + 1,CONCAT22(sStack_10e + 1,sStack_110 + 1)));
      in_stack_fffffffffffffd50 = extraout_XMM0_Qb;
    }
  }
  return;
}

Assistant:

void aom_paeth_predictor_32x64_ssse3(uint8_t *dst, ptrdiff_t stride,
                                     const uint8_t *above,
                                     const uint8_t *left) {
  const __m128i a = _mm_load_si128((const __m128i *)above);
  const __m128i b = _mm_load_si128((const __m128i *)(above + 16));
  const __m128i zero = _mm_setzero_si128();
  const __m128i al = _mm_unpacklo_epi8(a, zero);
  const __m128i ah = _mm_unpackhi_epi8(a, zero);
  const __m128i bl = _mm_unpacklo_epi8(b, zero);
  const __m128i bh = _mm_unpackhi_epi8(b, zero);

  const __m128i tl16 = _mm_set1_epi16((int16_t)above[-1]);
  const __m128i one = _mm_set1_epi16(1);
  __m128i l16;

  int i, j;
  for (j = 0; j < 4; ++j) {
    const __m128i l = _mm_load_si128((const __m128i *)(left + j * 16));
    __m128i rep = _mm_set1_epi16((short)0x8000);
    for (i = 0; i < 16; ++i) {
      l16 = _mm_shuffle_epi8(l, rep);
      const __m128i r32l = paeth_16x1_pred(&l16, &al, &ah, &tl16);
      const __m128i r32h = paeth_16x1_pred(&l16, &bl, &bh, &tl16);

      _mm_store_si128((__m128i *)dst, r32l);
      _mm_store_si128((__m128i *)(dst + 16), r32h);
      dst += stride;
      rep = _mm_add_epi16(rep, one);
    }
  }
}